

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_1,_1> __thiscall
tcu::operator-(tcu *this,Matrix<float,_1,_1> *a,Matrix<float,_1,_1> *b)

{
  float fVar1;
  float *pfVar2;
  float (*pafVar3) [1];
  Vector<float,_1> extraout_XMM0_Da [1];
  Vector<tcu::Vector<float,_1>,_1> VVar4;
  int local_2c;
  int local_28;
  int row;
  int col;
  Matrix<float,_1,_1> *b_local;
  Matrix<float,_1,_1> *a_local;
  Matrix<float,_1,_1> *res;
  
  Matrix<float,_1,_1>::Matrix((Matrix<float,_1,_1> *)this);
  VVar4.m_data[0].m_data[0] =
       (Vector<float,_1>  [1])(Vector<float,_1>  [1])extraout_XMM0_Da[0].m_data[0];
  for (local_28 = 0; local_28 < 1; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 1; local_2c = local_2c + 1) {
      pfVar2 = Matrix<float,_1,_1>::operator()(a,local_2c,local_28);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_1,_1>::operator()(b,local_2c,local_28);
      VVar4.m_data[0].m_data[0] = (Vector<float,_1>  [1])(fVar1 - *pfVar2);
      pafVar3 = (float (*) [1])
                Matrix<float,_1,_1>::operator()((Matrix<float,_1,_1> *)this,local_2c,local_28);
      (*pafVar3)[0] = (float)VVar4.m_data[0].m_data[0];
    }
  }
  return (Vector<tcu::Vector<float,_1>,_1>)
         (Vector<tcu::Vector<float,_1>,_1>)VVar4.m_data[0].m_data[0];
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) - b(row, col);
	return res;
}